

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O1

int dasm_link(BuildCtx *ctx,size_t *szp)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  dasm_State *pdVar4;
  dasm_ActList puVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  byte bVar9;
  int iVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  size_t sVar14;
  ulong uVar15;
  int *piVar16;
  int iVar17;
  byte *pbVar18;
  byte *pbVar19;
  bool bVar20;
  int *local_58;
  
  pdVar4 = ctx->D;
  *szp = 0;
  uVar7 = pdVar4->status;
  if (uVar7 == 0) {
    bVar20 = pdVar4->pcsize != 0;
    if (bVar20) {
      uVar7 = 0x22000000;
      if (*pdVar4->pclabels < 1) {
        uVar7 = 0;
        uVar11 = 4;
        do {
          bVar20 = uVar11 < pdVar4->pcsize;
          if (!bVar20) goto LAB_00106039;
          uVar7 = uVar7 + 1;
          piVar1 = (int *)((long)pdVar4->pclabels + uVar11);
          uVar11 = uVar11 + 4;
        } while (*piVar1 < 1);
        uVar7 = uVar7 | 0x22000000;
      }
    }
LAB_00106039:
    if (!bVar20) {
      uVar11 = pdVar4->lgsize;
      if (0x28 < uVar11) {
        piVar1 = pdVar4->lglabels;
        lVar8 = 10;
        do {
          if (0 < piVar1[lVar8]) {
            uVar7 = piVar1[lVar8];
            do {
              piVar16 = pdVar4->sections[uVar7 >> 0x18].rbuf;
              uVar2 = piVar16[uVar7];
              piVar16[uVar7] = -(int)lVar8;
              uVar7 = uVar2;
            } while (0 < (int)uVar2);
          }
          bVar20 = lVar8 != (uVar11 - 0x29 >> 2) + 10;
          lVar8 = lVar8 + 1;
        } while (bVar20);
      }
      if (pdVar4->maxsection < 1) {
        sVar14 = 0;
      }
      else {
        local_58 = &pdVar4->sections[0].ofs;
        uVar11 = 0;
        sVar14 = 0;
        do {
          iVar13 = (int)sVar14;
          iVar10 = (int)uVar11 << 0x18;
          iVar3 = pdVar4->sections[uVar11].pos;
          if (iVar10 != iVar3) {
            piVar1 = pdVar4->sections[uVar11].rbuf;
            puVar5 = pdVar4->actionlist;
            do {
              lVar8 = (long)iVar10;
              iVar10 = iVar10 + 1;
              bVar9 = 0;
              pbVar18 = puVar5 + piVar1[lVar8];
              do {
                pbVar19 = pbVar18 + 1;
                iVar13 = (int)sVar14;
                switch(*pbVar18) {
                case 0xf0:
                case 0xf1:
                case 0xf6:
                  pbVar19 = pbVar18 + 2;
                case 0xe9:
                case 0xea:
                case 0xeb:
                case 0xec:
                case 0xed:
                case 0xee:
                case 0xef:
                case 0xf2:
                case 0xf3:
                case 0xf7:
                  iVar10 = iVar10 + 1;
                  break;
                case 0xf4:
                  pbVar19 = pbVar18 + 2;
                case 0xf5:
                  iVar6 = (uint)((bVar9 & 0xf0) == 0x80) << 2;
                  if (bVar9 == 0xe9) {
                    iVar6 = 3;
                  }
                  iVar17 = 0;
                  if (iVar6 != 0) {
                    uVar7 = piVar1[iVar10];
                    if (-1 < (int)uVar7) {
                      uVar15 = (ulong)(uVar7 >> 0x18);
                      iVar12 = pdVar4->sections[uVar15].rbuf[uVar7];
                      if (iVar10 < (int)uVar7) {
                        piVar16 = local_58;
                        if (uVar11 < uVar15) {
                          do {
                            iVar12 = iVar12 + *piVar16;
                            uVar15 = uVar15 - 1;
                            piVar16 = piVar16 + 10;
                          } while (uVar11 != uVar15);
                        }
                      }
                      else {
                        iVar12 = iVar12 - iVar13;
                      }
                      iVar17 = iVar6;
                      if (0x7f < iVar12 - piVar1[(long)iVar10 + 1]) {
                        iVar17 = 0;
                      }
                      if (iVar12 - piVar1[(long)iVar10 + 1] < -0x80 - iVar6) {
                        iVar17 = 0;
                      }
                      sVar14 = (size_t)(uint)(iVar13 - iVar17);
                    }
                  }
                  piVar1[(long)iVar10 + 1] = iVar17;
                  iVar10 = iVar10 + 2;
                  break;
                case 0xf8:
                  pbVar19 = pbVar18 + 2;
                case 0xf9:
                  lVar8 = (long)iVar10;
                  iVar10 = iVar10 + 1;
                  piVar1[lVar8] = piVar1[lVar8] + iVar13;
                  break;
                case 0xfa:
                  lVar8 = (long)iVar10;
                  iVar10 = iVar10 + 1;
                  pbVar19 = pbVar18 + 2;
                  sVar14 = (size_t)(iVar13 - ((uint)pbVar18[1] & piVar1[lVar8] + iVar13));
                  goto LAB_0010620c;
                case 0xfb:
                  pbVar19 = pbVar18 + 3;
                  goto LAB_0010620c;
                case 0xfc:
                  bVar9 = pbVar18[1];
                  pbVar19 = pbVar18 + 2;
LAB_0010620c:
                  bVar20 = true;
                  goto LAB_00106132;
                case 0xfd:
                  break;
                case 0xfe:
                case 0xff:
                  bVar20 = false;
                  goto LAB_00106132;
                default:
                  bVar20 = true;
                  bVar9 = *pbVar18;
                  goto LAB_00106132;
                }
                bVar20 = true;
LAB_00106132:
                iVar13 = (int)sVar14;
                pbVar18 = pbVar19;
              } while (bVar20);
            } while (iVar10 != iVar3);
          }
          sVar14 = (long)iVar13 + (long)pdVar4->sections[uVar11].ofs;
          uVar11 = uVar11 + 1;
          local_58 = local_58 + 10;
        } while ((long)uVar11 < (long)pdVar4->maxsection);
      }
      uVar7 = 0;
      pdVar4->codesize = sVar14;
      *szp = sVar14;
    }
  }
  return uVar7;
}

Assistant:

int dasm_link(Dst_DECL, size_t *szp)
{
  dasm_State *D = Dst_REF;
  int secnum;
  int ofs = 0;

#ifdef DASM_CHECKS
  *szp = 0;
  if (D->status != DASM_S_OK) return D->status;
  {
    int pc;
    for (pc = 0; pc*sizeof(int) < D->pcsize; pc++)
      if (D->pclabels[pc] > 0) return DASM_S_UNDEF_PC|pc;
  }
#endif

  { /* Handle globals not defined in this translation unit. */
    int idx;
    for (idx = 10; idx*sizeof(int) < D->lgsize; idx++) {
      int n = D->lglabels[idx];
      /* Undefined label: Collapse rel chain and replace with marker (< 0). */
      while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = -idx; }
    }
  }

  /* Combine all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->rbuf;
    int pos = DASM_SEC2POS(secnum);
    int lastpos = sec->pos;

    while (pos != lastpos) {
      dasm_ActList p = D->actionlist + b[pos++];
      int op = 0;
      while (1) {
	int action = *p++;
	switch (action) {
	case DASM_REL_LG: p++;
	  /* fallthrough */
	case DASM_REL_PC: {
	  int shrink = op == 0xe9 ? 3 : ((op&0xf0) == 0x80 ? 4 : 0);
	  if (shrink) {  /* Shrinkable branch opcode? */
	    int lofs, lpos = b[pos];
	    if (lpos < 0) goto noshrink;  /* Ext global? */
	    lofs = *DASM_POS2PTR(D, lpos);
	    if (lpos > pos) {  /* Fwd label: add cumulative section offsets. */
	      int i;
	      for (i = secnum; i < DASM_POS2SEC(lpos); i++)
		lofs += D->sections[i].ofs;
	    } else {
	      lofs -= ofs;  /* Bkwd label: unfix offset. */
	    }
	    lofs -= b[pos+1];  /* Short branch ok? */
	    if (lofs >= -128-shrink && lofs <= 127) ofs -= shrink;  /* Yes. */
	    else { noshrink: shrink = 0; }  /* No, cannot shrink op. */
	  }
	  b[pos+1] = shrink;
	  pos += 2;
	  break;
	}
	  /* fallthrough */
	case DASM_SPACE: case DASM_IMM_LG: case DASM_VREG: p++;
	  /* fallthrough */
	case DASM_DISP: case DASM_IMM_S: case DASM_IMM_B: case DASM_IMM_W:
	case DASM_IMM_D: case DASM_IMM_WB: case DASM_IMM_DB:
	case DASM_SETLABEL: case DASM_REL_A: case DASM_IMM_PC: pos++; break;
	case DASM_LABEL_LG: p++;
	  /* fallthrough */
	case DASM_LABEL_PC: b[pos++] += ofs; break; /* Fix label offset. */
	case DASM_ALIGN: ofs -= (b[pos++]+ofs)&*p++; break; /* Adjust ofs. */
	case DASM_EXTERN: p += 2; break;
	case DASM_ESC: op = *p++; break;
	case DASM_MARK: break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	default: op = action; break;
	}
      }
      stop: (void)0;
    }
    ofs += sec->ofs;  /* Next section starts right after current section. */
  }

  D->codesize = ofs;  /* Total size of all code sections */
  *szp = ofs;
  return DASM_S_OK;
}